

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O1

void __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
::Initialize(WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
             *this,int capacity)

{
  undefined1 auVar1 [16];
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  Recycler *pRVar6;
  undefined4 *puVar7;
  int *__s;
  WeakRefDictionaryEntry<Js::RecyclableObject,_bool> *pWVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  undefined1 local_70 [8];
  TrackAllocData data;
  int modIndex;
  
  data._36_4_ = 0x4b;
  uVar4 = PrimePolicy::GetPrime(capacity,(int *)&data.field_0x24);
  uVar11 = (ulong)(int)uVar4;
  local_70 = (undefined1  [8])&int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_190cf2;
  data.filename._0_4_ = 0x1bd;
  data.plusSize = uVar11;
  pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_70);
  if (uVar4 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar6,(TrackAllocData *)0x0);
    __s = (int *)&DAT_00000008;
  }
  else {
    sVar10 = 0xffffffffffffffff;
    if (-1 < (int)uVar4) {
      sVar10 = uVar11 * 4;
    }
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00390dbf;
      *puVar7 = 0;
    }
    __s = (int *)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                           (pRVar6,sVar10);
    if (__s == (int *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_00390dbf;
      *puVar7 = 0;
    }
  }
  local_70 = (undefined1  [8])&WeakRefDictionaryEntry<Js::RecyclableObject,bool>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_190cf2;
  data.filename._0_4_ = 0x1be;
  data.plusSize = uVar11;
  pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_70);
  if (uVar4 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar6,(TrackAllocData *)0x0);
    pWVar8 = (WeakRefDictionaryEntry<Js::RecyclableObject,_bool> *)&DAT_00000008;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar11;
    sVar10 = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
      sVar10 = SUB168(auVar1 * ZEXT816(0x18),0);
    }
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00390dbf;
      *puVar7 = 0;
    }
    if (sVar10 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                         "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
      if (!bVar3) goto LAB_00390dbf;
      *puVar7 = 0;
    }
    pWVar8 = (WeakRefDictionaryEntry<Js::RecyclableObject,_bool> *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                       (pRVar6,sVar10);
    if (pWVar8 == (WeakRefDictionaryEntry<Js::RecyclableObject,_bool> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00390dbf:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    lVar9 = 0;
    do {
      *(undefined8 *)((long)&(pWVar8->key).ptr + lVar9) = 0;
      lVar9 = lVar9 + 0x18;
    } while (uVar11 * 0x18 != lVar9);
  }
  if ((__s != (int *)0x0) && (pWVar8 != (WeakRefDictionaryEntry<Js::RecyclableObject,_bool> *)0x0))
  {
    this->size = uVar4;
    Memory::Recycler::WBSetBit((char *)&this->buckets);
    (this->buckets).ptr = __s;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->buckets);
    if (0 < (int)uVar4) {
      memset(__s,0xff,(ulong)uVar4 << 2);
    }
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr = pWVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    this->freeList = -1;
    this->modFunctionIndex = data._36_4_;
  }
  return;
}

Assistant:

void Initialize(int capacity)
        {
            int modIndex = UNKNOWN_MOD_INDEX;
            int size = PrimePolicy::GetSize(capacity, &modIndex);

            int* buckets = RecyclerNewArrayLeaf(recycler, int, size);
            EntryType * entries = RecyclerNewArray(recycler, EntryType, size);

            // No need for auto pointers here since these are both recycler
            // allocated objects
            if (buckets != nullptr && entries != nullptr)
            {
                this->size = size;
                this->buckets = buckets;
                for (int i = 0; i < size; i++) buckets[i] = -1;
                this->entries = entries;
                this->freeList = -1;
                this->modFunctionIndex = modIndex;
            }
        }